

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

void remove_obj_fallen_wings(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  int sn;
  
  sn = skill_lookup("fly");
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    act("$n slowly floats back to the ground.",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("Your feet slowly float back to the ground.\n\r",ch);
    switchD_00333f01::default(ch,sn);
    return;
  }
  return;
}

Assistant:

void remove_obj_fallen_wings(CHAR_DATA *ch, OBJ_DATA *obj)
{
	int sn_fly = skill_lookup("fly");

	if (!is_affected(ch, sn_fly))
		return;

	act("$n slowly floats back to the ground.", ch, 0, 0, TO_ROOM);
	send_to_char("Your feet slowly float back to the ground.\n\r", ch);
	affect_strip(ch, sn_fly);
}